

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O2

XrEnvironmentBlendMode __thiscall
anon_unknown.dwarf_5b5eb::OpenXrProgram::GetPreferredBlendMode(OpenXrProgram *this)

{
  XrEnvironmentBlendMode XVar1;
  XrResult XVar2;
  size_type sVar3;
  pointer __x;
  uint32_t count;
  vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_> blendModes;
  allocator_type local_75;
  uint local_74;
  _Vector_base<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_> local_70;
  string local_58;
  string local_38;
  
  XVar2 = xrEnumerateEnvironmentBlendModes
                    (this->m_instance,this->m_systemId,
                     (((this->m_options).
                       super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->Parsed
                     ).ViewConfigType,0,&local_74,0);
  CheckXrResult(XVar2,
                "xrEnumerateEnvironmentBlendModes(m_instance, m_systemId, m_options->Parsed.ViewConfigType, 0, &count, nullptr)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:283"
               );
  if ((ulong)local_74 == 0) {
    std::__cxx11::string::string((string *)&local_38,"Check failed",(allocator *)&local_70);
    Throw(&local_38,"count > 0",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:284"
         );
  }
  std::vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>::vector
            ((vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_> *)&local_70,
             (ulong)local_74,&local_75);
  XVar2 = xrEnumerateEnvironmentBlendModes
                    (this->m_instance,this->m_systemId,
                     (((this->m_options).
                       super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->Parsed
                     ).ViewConfigType,local_74,&local_74,
                     local_70._M_impl.super__Vector_impl_data._M_start);
  CheckXrResult(XVar2,
                "xrEnumerateEnvironmentBlendModes(m_instance, m_systemId, m_options->Parsed.ViewConfigType, count, &count, blendModes.data())"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:288"
               );
  __x = local_70._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (__x == local_70._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string
                ((string *)&local_58,
                 "No acceptable blend mode returned from the xrEnumerateEnvironmentBlendModes",
                 (allocator *)&local_75);
      Throw(&local_58,(char *)0x0,
            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:292"
           );
    }
    sVar3 = std::
            set<XrEnvironmentBlendMode,_std::less<XrEnvironmentBlendMode>,_std::allocator<XrEnvironmentBlendMode>_>
            ::count(&this->m_acceptableBlendModes,__x);
    if (sVar3 != 0) break;
    __x = __x + 1;
  }
  XVar1 = *__x;
  std::_Vector_base<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>::~_Vector_base
            (&local_70);
  return XVar1;
}

Assistant:

XrEnvironmentBlendMode GetPreferredBlendMode() const override {
        uint32_t count;
        CHECK_XRCMD(xrEnumerateEnvironmentBlendModes(m_instance, m_systemId, m_options->Parsed.ViewConfigType, 0, &count, nullptr));
        CHECK(count > 0);

        std::vector<XrEnvironmentBlendMode> blendModes(count);
        CHECK_XRCMD(xrEnumerateEnvironmentBlendModes(m_instance, m_systemId, m_options->Parsed.ViewConfigType, count, &count,
                                                     blendModes.data()));
        for (const auto& blendMode : blendModes) {
            if (m_acceptableBlendModes.count(blendMode)) return blendMode;
        }
        THROW("No acceptable blend mode returned from the xrEnumerateEnvironmentBlendModes");
    }